

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qversionnumber.cpp
# Opt level: O2

QList<int> * __thiscall
QVersionNumber::segments(QList<int> *__return_storage_ptr__,QVersionNumber *this)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  pointer piVar4;
  qsizetype i;
  long index;
  
  bVar1 = (this->m_segments).field_0.inline_segments[0];
  if ((bVar1 & 1) == 0) {
    QArrayDataPointer<int>::QArrayDataPointer
              (&__return_storage_ptr__->d,&((this->m_segments).field_0.pointer_segments)->d);
  }
  else {
    (__return_storage_ptr__->d).size = 0;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (int *)0x0;
    QList<int>::resize(__return_storage_ptr__,(long)((char)bVar1 >> 1));
    index = 0;
    while( true ) {
      bVar1 = (this->m_segments).field_0.inline_segments[0];
      if ((bVar1 & 1) == 0) {
        lVar3 = (((this->m_segments).field_0.pointer_segments)->d).size;
      }
      else {
        lVar3 = (long)((char)bVar1 >> 1);
      }
      if (lVar3 <= index) break;
      iVar2 = segmentAt(this,index);
      piVar4 = QList<int>::data(__return_storage_ptr__);
      piVar4[index] = iVar2;
      index = index + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QList<int> QVersionNumber::segments() const
{
    if (m_segments.isUsingPointer())
        return *m_segments.pointer_segments;

    QList<int> result;
    result.resize(segmentCount());
    for (qsizetype i = 0; i < segmentCount(); ++i)
        result[i] = segmentAt(i);
    return result;
}